

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O2

void __thiscall
google::protobuf::internal::
InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
::~InternalMetadataWithArenaBase
          (InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           *this)

{
  UnknownFieldSet *this_00;
  
  if ((((ulong)this->ptr_ & 1) != 0) &&
     (this_00 = (UnknownFieldSet *)((ulong)this->ptr_ & 0xfffffffffffffffe),
     this_00[1].fields_.
     super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
     ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0)) {
    if (this_00 != (UnknownFieldSet *)0x0) {
      UnknownFieldSet::~UnknownFieldSet(this_00);
    }
    operator_delete(this_00,0x20);
  }
  this->ptr_ = (void *)0x0;
  return;
}

Assistant:

~InternalMetadataWithArenaBase() {
    if (have_unknown_fields() && arena() == NULL) {
      delete PtrValue<Container>();
    }
    ptr_ = NULL;
  }